

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_encoder_advanced.cpp
# Opt level: O3

void __thiscall
test_encoder_advanced_basic_example_code_choice_runtime_Test::
~test_encoder_advanced_basic_example_code_choice_runtime_Test
          (test_encoder_advanced_basic_example_code_choice_runtime_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_encoder_advanced, basic_example_code_choice_runtime) {
    unsigned seed = 42; // seed for PRNG

    // If the code choice is done at RUNTIME (will usually be the case, e.g. because QBER is known only at runtime),
    // need to provide containers for input and output with correct sizes, otherwise an exception will be thrown.
    // if we don't know the size of `key` at runtime, it will probably be a `std::vector`, not a `std::array`.
    std::size_t code_id = 0;  // Not `constexpr`, let's say we only know this value at runtime!

    std::vector<std::uint8_t> key_vec{};
    key_vec.resize(LDPC4QKD::get_input_size(code_id)); // get size at runtime!
    noise_bitstring_inplace(key_vec, 0.5, seed);  // create a random key

    // allocate a buffer for the syndrome (runtime-known length).
    std::vector<std::uint8_t> syndrome_vec{};
    syndrome_vec.resize(LDPC4QKD::get_output_size(code_id));

    // However,  if `key_vec.size()` and `syndrome_vec.size()` aren't exactly right for the chosen code,
    // then the above will throw `std::out_of_range` exception!
    LDPC4QKD::encode_with(code_id, key_vec, syndrome_vec);

    // Use the non-generic version of `encode_with`:
    std::cout << "Syndrome of runtime known size " << syndrome_vec.size() << std::endl;
    for (auto v: syndrome_vec) {
        std::cout << static_cast<int>(v) << ' ';  // print syndrome bits
    }
    std::cout << std::endl;
}